

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

int matchone(regex_t p,char c)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = p._0_4_ & 0xff;
  switch(uVar2) {
  case 1:
    break;
  default:
    bVar3 = (p.field_1._0_4_ & 0xff) == (int)c;
LAB_00115919:
    return (int)bVar3;
  case 8:
    iVar1 = matchcharclass(c,(char *)p.field_1.ccl);
    return iVar1;
  case 9:
    uVar2 = matchcharclass(c,(char *)p.field_1.ccl);
    uVar2 = uVar2 ^ 1;
    break;
  case 0xb:
    goto switchD_0011586b_caseD_b;
  case 0xc:
    if (c == '_') {
      return 1;
    }
    if (0xe5 < (byte)((c & 0xdfU) + 0xa5)) {
      return 1;
    }
  case 10:
    bVar3 = (byte)(c - 0x30U) < 10;
LAB_001158c3:
    return (int)bVar3;
  case 0xd:
    if (c == '_') {
      return 0;
    }
    if (0xe5 < (byte)((c & 0xdfU) + 0xa5)) {
      return 0;
    }
    goto switchD_0011586b_caseD_b;
  case 0xe:
    if ((0x20 < (uint)(int)c) ||
       (uVar2 = 1, (0x100003600U >> ((ulong)(uint)(int)c & 0x3f) & 1) == 0)) {
      bVar3 = c == '\v';
      goto LAB_00115919;
    }
    break;
  case 0xf:
    if ((0x20 < (uint)(int)c) ||
       (uVar2 = 0, (0x100003600U >> ((ulong)(uint)(int)c & 0x3f) & 1) == 0)) {
      return (int)(c != '\v');
    }
  }
  return uVar2;
switchD_0011586b_caseD_b:
  bVar3 = (byte)(c - 0x3aU) < 0xf6;
  goto LAB_001158c3;
}

Assistant:

static int matchone(regex_t p, char c)
{
  switch (p.type)
  {
    case DOT:            return 1;
    case CHAR_CLASS:     return  matchcharclass(c, (const char*)p.ccl);
    case INV_CHAR_CLASS: return !matchcharclass(c, (const char*)p.ccl);
    case DIGIT:          return  matchdigit(c);
    case NOT_DIGIT:      return !matchdigit(c);
    case ALPHA:          return  matchalphanum(c);
    case NOT_ALPHA:      return !matchalphanum(c);
    case WHITESPACE:     return  matchwhitespace(c);
    case NOT_WHITESPACE: return !matchwhitespace(c);
    default:             return  (p.ch == c);
  }
}